

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int ARKStepGetNonlinearSystemData
              (void *arkode_mem,realtype *tcur,N_Vector *zpred,N_Vector *z,N_Vector *Fi,
              realtype *gamma,N_Vector *sdata,void **user_data)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeARKStepMem *)0xedf1f7);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(local_40 + 0x198);
    *in_RDX = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x40);
    *in_RCX = *(undefined8 *)(local_40 + 0x108);
    *in_R8 = *(undefined8 *)
              (*(long *)((long)in_stack_ffffffffffffffb8 + 0x30) +
              (long)*(int *)((long)in_stack_ffffffffffffffb8 + 0x58) * 8);
    *in_R9 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x90);
    *in_stack_00000008 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x38);
    step_mem->fe = *(ARKRhsFn *)(local_40 + 0x10);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepGetNonlinearSystemData(void *arkode_mem, realtype *tcur,
                                  N_Vector *zpred, N_Vector *z,
                                  N_Vector *Fi, realtype *gamma,
                                  N_Vector *sdata, void **user_data)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepGetNonlinearSystemData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *tcur      = ark_mem->tcur;
  *zpred     = step_mem->zpred;
  *z         = ark_mem->ycur;
  *Fi        = step_mem->Fi[step_mem->istage];
  *gamma     = step_mem->gamma;
  *sdata     = step_mem->sdata;
  *user_data = ark_mem->user_data;

  return(ARK_SUCCESS);
}